

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void scalarmultiply(float32 **a,float32 x,int32 n)

{
  float32 *pfVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  uVar2 = 0;
  uVar3 = 0;
  if (0 < n) {
    uVar3 = (ulong)(uint)n;
  }
  lVar4 = 1;
  for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    pfVar1 = a[uVar2];
    pfVar1[uVar2] = (float32)((float)pfVar1[uVar2] * (float)x);
    for (lVar5 = lVar4; (int)lVar5 < n; lVar5 = lVar5 + 1) {
      pfVar1[lVar5] = (float32)((float)pfVar1[lVar5] * (float)x);
      a[lVar5][uVar2] = (float32)((float)a[lVar5][uVar2] * (float)x);
    }
    lVar4 = lVar4 + 1;
  }
  return;
}

Assistant:

void
scalarmultiply(float32 ** a, float32 x, int32 n)
{
    int32 i, j;

    for (i = 0; i < n; ++i) {
	a[i][i] *= x;
        for (j = i+1; j < n; ++j) {
            a[i][j] *= x;
            a[j][i] *= x;
	}
    }
}